

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

attr * findvar(char *s)

{
  Env *this;
  attr *paVar1;
  allocator local_31;
  string local_30;
  
  this = current;
  std::__cxx11::string::string((string *)&local_30,s,&local_31);
  paVar1 = Env::findvar(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return paVar1;
}

Assistant:

struct attr *findvar(const char *s) {
    return current->findvar(s);
}